

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item_Array.cxx
# Opt level: O3

int __thiscall
Fl_Tree_Item_Array::reparent
          (Fl_Tree_Item_Array *this,Fl_Tree_Item *item,Fl_Tree_Item *newparent,int pos)

{
  uint uVar1;
  Fl_Tree_Item **ppFVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  iVar3 = -1;
  if ((-1 < pos) && (iVar3 = -1, pos <= this->_total)) {
    enlarge(this,1);
    uVar1 = this->_total;
    uVar5 = (ulong)uVar1;
    this->_total = uVar1 + 1;
    uVar4 = (ulong)(uint)pos;
    if (pos < (int)uVar1) {
      do {
        this->_items[uVar5] = this->_items[uVar5 - 1];
        uVar5 = uVar5 - 1;
      } while ((long)uVar4 < (long)uVar5);
    }
    this->_items[uVar4] = item;
    ppFVar2 = this->_items;
    ppFVar2[uVar4]->_parent = newparent;
    Fl_Tree_Item::update_prev_next(ppFVar2[uVar4],pos);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int Fl_Tree_Item_Array::reparent(Fl_Tree_Item *item, Fl_Tree_Item* newparent, int pos) {
  if ( pos<0 || pos>_total ) return -1;
  // Add item to new parent
  enlarge(1);
  _total += 1;
  for ( int t=_total-1; t>pos; --t )    // shuffle array to make room for new entry
    _items[t] = _items[t-1];
  _items[pos] = item;                   // insert new entry
  // Attach to new parent and siblings
  _items[pos]->parent(newparent);       // reparent (update_prev_next() needs this)
  _items[pos]->update_prev_next(pos);   // find new siblings
  return 0;
}